

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O1

void __thiscall duckdb::StructColumnData::Verify(StructColumnData *this,RowGroup *parent)

{
  return;
}

Assistant:

void StructColumnData::Verify(RowGroup &parent) {
#ifdef DEBUG
	ColumnData::Verify(parent);
	validity.Verify(parent);
	for (auto &sub_column : sub_columns) {
		sub_column->Verify(parent);
	}
#endif
}